

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 float64_sqrt_sparc64(float64 xa,float_status *s)

{
  int iVar1;
  float64 fVar2;
  double dVar3;
  union_float64 ua;
  double local_18;
  
  local_18 = (double)xa;
  if (((s->float_exception_flags & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      float64_input_flush__nocheck((float64 *)&local_18,s);
    }
    xa = (float64)local_18;
    iVar1 = __fpclassify(local_18);
    if (((iVar1 == 4) || (iVar1 == 2)) && (-1 < (long)xa)) {
      if ((double)xa < 0.0) {
        dVar3 = sqrt((double)xa);
      }
      else {
        dVar3 = SQRT((double)xa);
      }
      return (float64)dVar3;
    }
  }
  fVar2 = soft_f64_sqrt(xa,s);
  return fVar2;
}

Assistant:

float64 QEMU_FLATTEN float64_sqrt(float64 xa, float_status *s)
{
    union_float64 ua, ur;

    ua.s = xa;
    if (unlikely(!can_use_fpu(s))) {
        goto soft;
    }

    float64_input_flush1(&ua.s, s);
    if (QEMU_HARDFLOAT_1F64_USE_FP) {
        if (unlikely(!(fpclassify(ua.h) == FP_NORMAL ||
                       fpclassify(ua.h) == FP_ZERO) ||
                     signbit(ua.h))) {
            goto soft;
        }
    } else if (unlikely(!float64_is_zero_or_normal(ua.s) ||
                        float64_is_neg(ua.s))) {
        goto soft;
    }
    ur.h = sqrt(ua.h);
    return ur.s;

 soft:
    return soft_f64_sqrt(ua.s, s);
}